

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

BlockCode __thiscall
s2coding::GetBlockCode
          (s2coding *this,Span<const_unsigned_long_long> values,uint64 base,bool have_exceptions)

{
  BlockCode BVar1;
  bool bVar2;
  int iVar3;
  unsigned_long_long *puVar4;
  int *piVar5;
  size_type sVar6;
  uint64 uVar7;
  ostream *poVar8;
  long lVar9;
  S2LogMessage local_110;
  S2LogMessageVoidify local_f9;
  ulong local_f8;
  uint64 min_offset;
  uint64 mask;
  int offset_shift;
  int offset_bits;
  uint64 max_delta;
  S2LogMessage local_d0;
  S2LogMessageVoidify local_ba;
  byte local_b9;
  S2LogMessage local_b8;
  S2LogMessageVoidify local_a5 [20];
  byte local_91;
  S2LogMessage local_90;
  S2LogMessageVoidify local_79;
  int local_78;
  int local_74;
  int overlap_bits;
  uint local_6c;
  unsigned_long_long uStack_68;
  int delta_bits;
  uint64 v;
  iterator __end1;
  iterator __begin1;
  Span<const_unsigned_long_long> *__range1;
  uint64 b_max;
  uint64 b_min;
  size_type sStack_30;
  bool have_exceptions_local;
  uint64 base_local;
  Span<const_unsigned_long_long> values_local;
  uint uStack_10;
  int local_c;
  
  sStack_30 = values.len_;
  values_local.ptr_ = values.ptr_;
  b_min._7_1_ = (byte)base & 1;
  b_max = 0xffffffffffffffff;
  __range1 = (Span<const_unsigned_long_long> *)0x0;
  __begin1 = &base_local;
  base_local = (uint64)this;
  __end1 = absl::Span<const_unsigned_long_long>::begin((Span<const_unsigned_long_long> *)__begin1);
  v = (uint64)absl::Span<const_unsigned_long_long>::end((Span<const_unsigned_long_long> *)__begin1);
  for (; __end1 != (iterator)v; __end1 = __end1 + 1) {
    uStack_68 = *__end1;
    if (uStack_68 != 0xffffffffffffffff) {
      puVar4 = std::min<unsigned_long_long>(&b_max,&stack0xffffffffffffff98);
      b_max = *puVar4;
      puVar4 = std::max<unsigned_long_long>
                         ((unsigned_long_long *)&__range1,&stack0xffffffffffffff98);
      __range1 = (Span<const_unsigned_long_long> *)*puVar4;
    }
  }
  if (b_max == 0xffffffffffffffff) {
    values_local.len_._4_4_ = 4;
    uStack_10 = 0;
    local_c = 0;
  }
  else {
    b_max = b_max - sStack_30;
    __range1 = (Span<const_unsigned_long_long> *)((long)__range1 - sStack_30);
    overlap_bits = 1;
    local_74 = Bits::Log2Floor64((long)__range1 - b_max);
    piVar5 = std::max<int>(&overlap_bits,&local_74);
    local_6c = *piVar5 + 3U & 0xfffffffc;
    local_78 = 0;
    bVar2 = CanEncode(b_max,(uint64)__range1,local_6c,0,(bool)(b_min._7_1_ & 1));
    if (!bVar2) {
      bVar2 = CanEncode(b_max,(uint64)__range1,local_6c,4,(bool)(b_min._7_1_ & 1));
      if (bVar2) {
        local_78 = 4;
      }
      else {
        local_91 = 0;
        if (0x3c < (int)local_6c) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_90,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x2da,kFatal,(ostream *)&std::cerr);
          local_91 = 1;
          poVar8 = S2LogMessage::stream(&local_90);
          poVar8 = std::operator<<(poVar8,"Check failed: (delta_bits) <= (60) ");
          S2LogMessageVoidify::operator&(&local_79,poVar8);
        }
        if ((local_91 & 1) != 0) {
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
        }
        local_6c = local_6c + 4;
        bVar2 = CanEncode(b_max,(uint64)__range1,local_6c,0,(bool)(b_min._7_1_ & 1));
        if (!bVar2) {
          bVar2 = CanEncode(b_max,(uint64)__range1,local_6c,4,(bool)(b_min._7_1_ & 1));
          local_b9 = 0;
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                       ,0x2dd,kFatal,(ostream *)&std::cerr);
            local_b9 = 1;
            poVar8 = S2LogMessage::stream(&local_b8);
            poVar8 = std::operator<<(poVar8,
                                     "Check failed: CanEncode(b_min, b_max, delta_bits, 4, have_exceptions) "
                                    );
            S2LogMessageVoidify::operator&(local_a5,poVar8);
          }
          if ((local_b9 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b8);
          }
          local_78 = 4;
        }
      }
    }
    sVar6 = absl::Span<const_unsigned_long_long>::size
                      ((Span<const_unsigned_long_long> *)&base_local);
    if (sVar6 == 1) {
      max_delta._7_1_ = 0;
      if (local_6c != 4 || local_78 != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x2e6,kFatal,(ostream *)&std::cerr);
        max_delta._7_1_ = 1;
        poVar8 = S2LogMessage::stream(&local_d0);
        poVar8 = std::operator<<(poVar8,"Check failed: delta_bits == 4 && overlap_bits == 0 ");
        S2LogMessageVoidify::operator&(&local_ba,poVar8);
      }
      if ((max_delta._7_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_d0);
      }
      local_6c = 8;
    }
    uVar7 = BitMask(local_6c);
    lVar9 = 0;
    if ((b_min._7_1_ & 1) != 0) {
      lVar9 = 0x10;
    }
    _offset_shift = (Span<const_unsigned_long_long> *)(uVar7 - lVar9);
    mask._4_4_ = 0;
    if (_offset_shift < __range1) {
      mask._0_4_ = local_6c - local_78;
      min_offset = BitMask((int)mask);
      local_f8 = (long)__range1 + (min_offset - (long)_offset_shift) &
                 (min_offset ^ 0xffffffffffffffff);
      if (local_f8 == 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_110,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x2f4,kFatal,(ostream *)&std::cerr);
        poVar8 = S2LogMessage::stream(&local_110);
        poVar8 = std::operator<<(poVar8,"Check failed: (min_offset) > (0) ");
        S2LogMessageVoidify::operator&(&local_f9,poVar8);
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_110);
      }
      iVar3 = Bits::FindMSBSetNonZero64(local_f8);
      mask._4_4_ = (iVar3 - (int)mask) + 8U & 0xfffffff8;
      if (mask._4_4_ == 0x40) {
        local_78 = 4;
      }
    }
    values_local.len_._4_4_ = local_6c;
    uStack_10 = mask._4_4_;
    local_c = local_78;
  }
  BVar1.offset_bits = uStack_10;
  BVar1.delta_bits = values_local.len_._4_4_;
  BVar1.overlap_bits = local_c;
  return BVar1;
}

Assistant:

BlockCode GetBlockCode(Span<const uint64> values, uint64 base,
                       bool have_exceptions) {
  // "b_min" and "b_max"n are the minimum and maximum values within this block.
  uint64 b_min = kException, b_max = 0;
  for (uint64 v : values) {
    if (v != kException) {
      b_min = min(b_min, v);
      b_max = max(b_max, v);
    }
  }
  if (b_min == kException) {
    // All values in this block are exceptions.
    return BlockCode{4, 0, 0};
  }

  // Adjust the min/max values so that they are relative to "base".
  b_min -= base;
  b_max -= base;

  // Determine the minimum possible delta length and overlap that can be used
  // to encode this block.  The block will usually be encodable using the
  // number of bits in (b_max - b_min) rounded up to a multiple of 4.  If this
  // is not possible, the preferred solution is to shift "offset" so that the
  // delta and offset values overlap by 4 bits (since this only costs an
  // average of 4 extra bits per block).  Otherwise we increase the delta size
  // by 4 bits.  Certain cases require that both of these techniques are used.
  //
  // Example 1: b_min = 0x72, b_max = 0x7e.  The range is 0x0c.  This can be
  // encoded using delta_bits = 4 and overlap_bits = 0, which allows us to
  // represent an offset of 0x70 and a maximum delta of 0x0f, so that we can
  // encode values up to 0x7f.
  //
  // Example 2: b_min = 0x78, b_max = 0x84.  The range is 0x0c, but in this
  // case it is not sufficient to use delta_bits = 4 and overlap_bits = 0
  // because we can again only represent an offset of 0x70, so the maximum
  // delta of 0x0f only lets us encode values up to 0x7f.  However if we
  // increase the overlap to 4 bits then we can represent an offset of 0x78,
  // which lets us encode values up to 0x78 + 0x0f = 0x87.
  //
  // Example 3: b_min = 0x08, b_max = 0x104.  The range is 0xfc, so we should
  // be able to use 8-bit deltas.  But even with a 4-bit overlap, we can still
  // only encode offset = 0 and a maximum value of 0xff.  (We don't allow
  // bigger overlaps because statistically they are not worthwhile.)  Instead
  // we increase the delta size to 12 bits, which handles this case easily.
  //
  // Example 4: b_min = 0xf08, b_max = 0x1004.  The range is 0xfc, so we
  // should be able to use 8-bit deltas.  With 8-bit deltas and no overlap, we
  // have offset = 0xf00 and a maximum encodable value of 0xfff.  With 8-bit
  // deltas and a 4-bit overlap, we still have offset = 0xf00 and a maximum
  // encodable value of 0xfff.  Even with 12-bit deltas, we have offset = 0
  // and we can still only represent 0xfff.  However with delta_bits = 12 and
  // overlap_bits = 4, we can represent offset = 0xf00 and a maximum encodable
  // value of 0xf00 + 0xfff = 0x1eff.
  //
  // It is possible to show that this last example is the worst case, i.e.  we
  // do not need to consider increasing delta_bits or overlap_bits further.
  int delta_bits = (max(1, Bits::Log2Floor64(b_max - b_min)) + 3) & ~3;
  int overlap_bits = 0;
  if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
    if (CanEncode(b_min, b_max, delta_bits, 4, have_exceptions)) {
      overlap_bits = 4;
    } else {
      S2_DCHECK_LE(delta_bits, 60);
      delta_bits += 4;
      if (!CanEncode(b_min, b_max, delta_bits, 0, have_exceptions)) {
        S2_DCHECK(CanEncode(b_min, b_max, delta_bits, 4, have_exceptions));
        overlap_bits = 4;
      }
    }
  }

  // Avoid wasting 4 bits of delta when the block size is 1.  This reduces the
  // encoding size for single leaf cells by one byte.
  if (values.size() == 1) {
    S2_DCHECK(delta_bits == 4 && overlap_bits == 0);
    delta_bits = 8;
  }

  // Now determine the number of bytes needed to encode "offset", given the
  // chosen delta length.
  uint64 max_delta = BitMask(delta_bits) - (have_exceptions ? kBlockSize : 0);
  int offset_bits = 0;
  if (b_max > max_delta) {
    // At least one byte of offset is required.  Round up the minimum offset
    // to the next encodable value, and determine how many bits it has.
    int offset_shift = delta_bits - overlap_bits;
    uint64 mask = BitMask(offset_shift);
    uint64 min_offset = (b_max - max_delta + mask) & ~mask;
    S2_DCHECK_GT(min_offset, 0);
    offset_bits =
        (Bits::FindMSBSetNonZero64(min_offset) + 1 - offset_shift + 7) & ~7;
    // A 64-bit offset can only be encoded with an overlap of 4 bits.
    if (offset_bits == 64) overlap_bits = 4;
  }
  return BlockCode{delta_bits, offset_bits, overlap_bits};
}